

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O3

void __thiscall argo::pointer::build_from_json_string(pointer *this,string *pointer)

{
  ulong uVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  size_t sVar7;
  ulong uVar8;
  size_t start;
  token local_70;
  size_t local_40;
  ulong local_38;
  
  local_40 = 0;
  uVar5 = pointer->_M_string_length;
  if (uVar5 == 0) {
    paVar3 = &local_70.m_name.field_2;
    local_70.m_type = all_e;
    local_70.m_name._M_string_length = 0;
    local_70.m_name.field_2._M_local_buf[0] = '\0';
    local_70.m_index = 0;
    local_70.m_name._M_dataplus._M_p = (pointer)paVar3;
    p_Var6 = (_List_node_base *)operator_new(0x40);
    *(type_t *)&p_Var6[1]._M_next = local_70.m_type;
    p_Var6[1]._M_prev = (_List_node_base *)&p_Var6[2]._M_prev;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_name._M_dataplus._M_p == paVar3) {
      p_Var6[2]._M_prev =
           (_List_node_base *)
           CONCAT71(local_70.m_name.field_2._M_allocated_capacity._1_7_,
                    local_70.m_name.field_2._M_local_buf[0]);
      p_Var6[3]._M_next = (_List_node_base *)local_70.m_name.field_2._8_8_;
    }
    else {
      p_Var6[1]._M_prev = (_List_node_base *)local_70.m_name._M_dataplus._M_p;
      p_Var6[2]._M_prev =
           (_List_node_base *)
           CONCAT71(local_70.m_name.field_2._M_allocated_capacity._1_7_,
                    local_70.m_name.field_2._M_local_buf[0]);
    }
    p_Var6[2]._M_next = (_List_node_base *)local_70.m_name._M_string_length;
    local_70.m_name._M_string_length = 0;
    local_70.m_name.field_2._M_local_buf[0] = '\0';
    p_Var6[3]._M_prev = (_List_node_base *)local_70.m_index;
    local_70.m_name._M_dataplus._M_p = (pointer)paVar3;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar2 = &(this->m_path).
              super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>._M_impl.
              _M_node._M_size;
    *psVar2 = *psVar2 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_70.m_name._M_dataplus._M_p);
    }
  }
  else {
    paVar3 = &local_70.m_name.field_2;
    do {
      sVar7 = local_40;
      uVar8 = local_40 + 1;
      if (local_40 + 1 < uVar5) {
        uVar8 = uVar5;
      }
      do {
        uVar1 = sVar7 + 1;
        local_38 = uVar8;
        if (uVar5 <= uVar1) break;
        lVar4 = sVar7 + 1;
        sVar7 = uVar1;
        local_38 = uVar1;
      } while ((pointer->_M_dataplus)._M_p[lVar4] != '/');
      translate_jsonp_token(&local_70,this,pointer,&local_40,&local_38);
      p_Var6 = (_List_node_base *)operator_new(0x40);
      *(type_t *)&p_Var6[1]._M_next = local_70.m_type;
      p_Var6[1]._M_prev = (_List_node_base *)&p_Var6[2]._M_prev;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.m_name._M_dataplus._M_p == paVar3) {
        p_Var6[2]._M_prev =
             (_List_node_base *)
             CONCAT71(local_70.m_name.field_2._M_allocated_capacity._1_7_,
                      local_70.m_name.field_2._M_local_buf[0]);
        p_Var6[3]._M_next = (_List_node_base *)local_70.m_name.field_2._8_8_;
      }
      else {
        p_Var6[1]._M_prev = (_List_node_base *)local_70.m_name._M_dataplus._M_p;
        p_Var6[2]._M_prev =
             (_List_node_base *)
             CONCAT71(local_70.m_name.field_2._M_allocated_capacity._1_7_,
                      local_70.m_name.field_2._M_local_buf[0]);
      }
      p_Var6[2]._M_next = (_List_node_base *)local_70.m_name._M_string_length;
      local_70.m_name._M_string_length = 0;
      local_70.m_name.field_2._M_local_buf[0] = '\0';
      p_Var6[3]._M_prev = (_List_node_base *)local_70.m_index;
      local_70.m_name._M_dataplus._M_p = (pointer)paVar3;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar2 = &(this->m_path).
                super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>.
                _M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.m_name._M_dataplus._M_p != paVar3) {
        operator_delete(local_70.m_name._M_dataplus._M_p);
      }
      uVar5 = pointer->_M_string_length;
    } while (local_40 < uVar5);
  }
  return;
}

Assistant:

void pointer::build_from_json_string(const std::string &pointer)
{
    size_t start = 0;
    size_t end = 0;

    if (pointer.size() == 0)
    {
        m_path.push_back(token());
    }
    else
    {
        while (next_token(pointer, start, end))
        {
            m_path.push_back(translate_jsonp_token(pointer, start, end));
        }
    }
}